

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat.cpp
# Opt level: O2

void duckdb::RepeatListFunction(DataChunk *args,ExpressionState *param_2,Vector *result)

{
  VectorType VVar1;
  VectorType VVar2;
  unsigned_long *puVar3;
  list_entry_t *plVar4;
  data_ptr_t pdVar5;
  long *plVar6;
  data_ptr_t pdVar7;
  anon_class_32_4_1eb07289 fun;
  anon_class_32_4_1eb07289 fun_00;
  anon_class_32_4_1eb07289 fun_01;
  anon_class_32_4_1eb07289 fun_02;
  anon_class_32_4_1eb07289 fun_03;
  anon_class_32_4_1eb07289 fun_04;
  anon_class_32_4_1eb07289 fun_05;
  anon_class_32_4_1eb07289 fun_06;
  anon_class_32_4_1eb07289 fun_07;
  anon_class_32_4_1eb07289 fun_08;
  anon_class_32_4_1eb07289 fun_09;
  anon_class_32_4_1eb07289 fun_10;
  reference vector;
  reference vector_00;
  Vector *pVVar8;
  Vector *pVVar9;
  ValidityMask *pVVar10;
  ValidityMask *pVVar11;
  ValidityMask *pVVar12;
  ValidityMask *pVVar13;
  ValidityMask *pVVar14;
  ValidityMask *pVVar15;
  ulong uVar17;
  ulong uVar18;
  uint64_t *puVar19;
  idx_t in_R8;
  ValidityMask *count;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  list_entry_t left;
  list_entry_t left_00;
  list_entry_t left_01;
  list_entry_t left_02;
  list_entry_t left_03;
  list_entry_t left_04;
  list_entry_t left_05;
  list_entry_t lVar24;
  idx_t current_size;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat ldata;
  undefined7 uVar16;
  
  vector = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  pVVar8 = ListVector::GetEntry(vector);
  pVVar9 = ListVector::GetEntry(result);
  current_size = ListVector::GetListSize(result);
  count = (ValidityMask *)args->count;
  VVar1 = vector->vector_type;
  VVar2 = vector_00->vector_type;
  uVar16 = (undefined7)((ulong)&current_size >> 8);
  pVVar14 = (ValidityMask *)CONCAT71(uVar16,VVar2);
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    plVar4 = (list_entry_t *)result->data;
    if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
       ((puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
      fun_01.result = result;
      fun_01.current_size = &current_size;
      fun_01.source_child = pVVar8;
      fun_01.result_child = pVVar9;
      lVar24 = BinaryLambdaWrapper::
               Operation<duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,long,duckdb::list_entry_t>
                         (fun_01,*(list_entry_t *)vector->data,
                          (long)(((ValidityMask *)vector_00->data)->
                                super_TemplatedValidityMask<unsigned_long>).validity_mask,
                          (ValidityMask *)vector_00->data,in_R8);
      *plVar4 = lVar24;
      goto LAB_00d5c4ef;
    }
  }
  else {
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      pdVar5 = vector->data;
      plVar6 = (long *)vector_00->data;
      puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar7 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::SetValidity(result,&vector->validity);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          lVar22 = 8;
          while (bVar23 = count != (ValidityMask *)0x0,
                count = (ValidityMask *)
                        ((long)&count[-1].super_TemplatedValidityMask<unsigned_long>.capacity + 7),
                bVar23) {
            fun_05.result = result;
            fun_05.current_size = &current_size;
            fun_05.source_child = pVVar8;
            fun_05.result_child = pVVar9;
            left_02.length = *(uint64_t *)(pdVar5 + lVar22);
            left_02.offset = *(uint64_t *)(pdVar5 + lVar22 + -8);
            lVar24 = BinaryLambdaWrapper::
                     Operation<duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,long,duckdb::list_entry_t>
                               (fun_05,left_02,*plVar6,pVVar14,in_R8);
            *(uint64_t *)(pdVar7 + lVar22 + -8) = lVar24.offset;
            *(uint64_t *)(pdVar7 + lVar22) = lVar24.length;
            lVar22 = lVar22 + 0x10;
          }
        }
        else {
          pVVar14 = (ValidityMask *)0x0;
          for (uVar17 = 0;
              uVar17 != (ulong)((long)&count[1].super_TemplatedValidityMask<unsigned_long>.capacity
                               + 7U) >> 6; uVar17 = uVar17 + 1) {
            puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar3 == (unsigned_long *)0x0) {
              pVVar11 = pVVar14 + 2;
              if (count <= pVVar14 + 2) {
                pVVar11 = count;
              }
LAB_00d5be34:
              uVar20 = (long)pVVar14 << 4 | 8;
              pVVar15 = count;
              for (; pVVar10 = pVVar14, pVVar14 < pVVar11;
                  pVVar14 = (ValidityMask *)
                            ((long)&(pVVar14->super_TemplatedValidityMask<unsigned_long>).
                                    validity_mask + 1)) {
                fun.result = result;
                fun.current_size = &current_size;
                fun.source_child = pVVar8;
                fun.result_child = pVVar9;
                left.length = *(uint64_t *)(pdVar5 + uVar20);
                left.offset = *(uint64_t *)(pdVar5 + (uVar20 - 8));
                lVar24 = BinaryLambdaWrapper::
                         Operation<duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,long,duckdb::list_entry_t>
                                   (fun,left,*plVar6,pVVar15,in_R8);
                *(uint64_t *)(pdVar7 + (uVar20 - 8)) = lVar24.offset;
                *(uint64_t *)(pdVar7 + uVar20) = lVar24.length;
                uVar20 = uVar20 + 0x10;
              }
            }
            else {
              uVar20 = puVar3[uVar17];
              pVVar11 = pVVar14 + 2;
              if (count <= pVVar14 + 2) {
                pVVar11 = count;
              }
              if (uVar20 == 0xffffffffffffffff) goto LAB_00d5be34;
              pVVar10 = pVVar11;
              if (uVar20 != 0) {
                uVar18 = (long)pVVar14 << 4 | 8;
                pVVar15 = count;
                for (uVar21 = 0;
                    pVVar10 = (ValidityMask *)
                              ((long)&(pVVar14->super_TemplatedValidityMask<unsigned_long>).
                                      validity_mask + uVar21), pVVar10 < pVVar11;
                    uVar21 = uVar21 + 1) {
                  if ((uVar20 >> (uVar21 & 0x3f) & 1) != 0) {
                    fun_00.result = result;
                    fun_00.current_size = &current_size;
                    fun_00.source_child = pVVar8;
                    fun_00.result_child = pVVar9;
                    left_00.length = *(uint64_t *)(pdVar5 + uVar18);
                    left_00.offset = *(uint64_t *)(pdVar5 + (uVar18 - 8));
                    lVar24 = BinaryLambdaWrapper::
                             Operation<duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,long,duckdb::list_entry_t>
                                       (fun_00,left_00,*plVar6,pVVar15,in_R8);
                    *(uint64_t *)(pdVar7 + (uVar18 - 8)) = lVar24.offset;
                    *(uint64_t *)(pdVar7 + uVar18) = lVar24.length;
                  }
                  uVar18 = uVar18 + 0x10;
                }
              }
            }
            pVVar14 = pVVar10;
          }
        }
        goto LAB_00d5c4ef;
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
        pVVar14 = (ValidityMask *)CONCAT71(uVar16,VVar2 | VVar1);
        if ((VVar2 | VVar1) == FLAT_VECTOR) {
          pdVar5 = vector->data;
          pdVar7 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pVVar11 = (ValidityMask *)result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::SetValidity(result,&vector->validity);
          FlatVector::VerifyFlatVector(vector_00);
          ValidityMask::Combine(&result->validity,&vector_00->validity,(idx_t)count);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            lVar22 = 0;
            while (bVar23 = count != (ValidityMask *)0x0,
                  count = (ValidityMask *)
                          ((long)&count[-1].super_TemplatedValidityMask<unsigned_long>.capacity + 7)
                  , bVar23) {
              fun_10.result = result;
              fun_10.current_size = &current_size;
              fun_10.source_child = pVVar8;
              fun_10.result_child = pVVar9;
              lVar24.length = *(uint64_t *)(pdVar5 + lVar22 * 2 + 8);
              lVar24.offset = *(uint64_t *)(pdVar5 + lVar22 * 2);
              lVar24 = BinaryLambdaWrapper::
                       Operation<duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,long,duckdb::list_entry_t>
                                 (fun_10,lVar24,*(long *)(pdVar7 + lVar22),pVVar14,in_R8);
              *(uint64_t *)
               ((long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask +
               lVar22 * 2) = lVar24.offset;
              *(uint64_t *)
               ((long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + lVar22 * 2) = lVar24.length;
              lVar22 = lVar22 + 8;
            }
          }
          else {
            pVVar14 = (ValidityMask *)0x0;
            for (pVVar15 = (ValidityMask *)0x0;
                pVVar15 !=
                (ValidityMask *)
                ((ulong)((long)&count[1].super_TemplatedValidityMask<unsigned_long>.capacity + 7U)
                >> 6); pVVar15 = (ValidityMask *)
                                 ((long)&(pVVar15->super_TemplatedValidityMask<unsigned_long>).
                                         validity_mask + 1)) {
              puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar3 == (unsigned_long *)0x0) {
                pVVar10 = pVVar14 + 2;
                if (count <= pVVar14 + 2) {
                  pVVar10 = count;
                }
LAB_00d5c328:
                uVar17 = (long)pVVar14 << 4 | 8;
                pVVar12 = pVVar15;
                for (; pVVar13 = pVVar14, pVVar14 < pVVar10;
                    pVVar14 = (ValidityMask *)
                              ((long)&(pVVar14->super_TemplatedValidityMask<unsigned_long>).
                                      validity_mask + 1)) {
                  fun_06.result = result;
                  fun_06.current_size = &current_size;
                  fun_06.source_child = pVVar8;
                  fun_06.result_child = pVVar9;
                  left_03.length = *(uint64_t *)(pdVar5 + uVar17);
                  left_03.offset = *(uint64_t *)(pdVar5 + (uVar17 - 8));
                  lVar24 = BinaryLambdaWrapper::
                           Operation<duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,long,duckdb::list_entry_t>
                                     (fun_06,left_03,*(long *)(pdVar7 + (long)pVVar14 * 8),pVVar12,
                                      in_R8);
                  *(uint64_t *)((long)pVVar11 + (uVar17 - 8)) = lVar24.offset;
                  *(uint64_t *)
                   ((long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                   uVar17) = lVar24.length;
                  uVar17 = uVar17 + 0x10;
                }
              }
              else {
                uVar17 = puVar3[(long)pVVar15];
                pVVar10 = pVVar14 + 2;
                if (count <= pVVar14 + 2) {
                  pVVar10 = count;
                }
                if (uVar17 == 0xffffffffffffffff) goto LAB_00d5c328;
                pVVar13 = pVVar10;
                if (uVar17 != 0) {
                  uVar18 = (long)pVVar14 << 4 | 8;
                  pVVar12 = pVVar15;
                  for (uVar20 = 0;
                      pVVar13 = (ValidityMask *)
                                ((long)&(pVVar14->super_TemplatedValidityMask<unsigned_long>).
                                        validity_mask + uVar20), pVVar13 < pVVar10;
                      uVar20 = uVar20 + 1) {
                    if ((uVar17 >> (uVar20 & 0x3f) & 1) != 0) {
                      fun_07.result = result;
                      fun_07.current_size = &current_size;
                      fun_07.source_child = pVVar8;
                      fun_07.result_child = pVVar9;
                      left_04.length = *(uint64_t *)(pdVar5 + uVar18);
                      left_04.offset = *(uint64_t *)(pdVar5 + (uVar18 - 8));
                      lVar24 = BinaryLambdaWrapper::
                               Operation<duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,long,duckdb::list_entry_t>
                                         (fun_07,left_04,
                                          *(long *)(pdVar7 + uVar20 * 8 + (long)pVVar14 * 8),pVVar12
                                          ,in_R8);
                      *(uint64_t *)((long)pVVar11 + (uVar18 - 8)) = lVar24.offset;
                      *(uint64_t *)
                       ((long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                       uVar18) = lVar24.length;
                      pVVar12 = pVVar11;
                    }
                    uVar18 = uVar18 + 0x10;
                  }
                }
              }
              pVVar14 = pVVar13;
            }
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
          Vector::ToUnifiedFormat(vector,(idx_t)count,&ldata);
          Vector::ToUnifiedFormat(vector_00,(idx_t)count,&local_c0);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar5 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            puVar19 = (uint64_t *)(pdVar5 + 8);
            for (pVVar14 = (ValidityMask *)0x0; count != pVVar14;
                pVVar14 = (ValidityMask *)
                          ((long)&(pVVar14->super_TemplatedValidityMask<unsigned_long>).
                                  validity_mask + 1)) {
              pVVar11 = pVVar14;
              if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                pVVar11 = (ValidityMask *)(ulong)(ldata.sel)->sel_vector[(long)pVVar14];
              }
              pVVar15 = pVVar14;
              if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
                pVVar15 = (ValidityMask *)(ulong)(local_c0.sel)->sel_vector[(long)pVVar14];
              }
              fun_02.result = result;
              fun_02.current_size = &current_size;
              fun_02.source_child = pVVar8;
              fun_02.result_child = pVVar9;
              left_01.length = *(uint64_t *)(ldata.data + (long)pVVar11 * 0x10 + 8);
              left_01.offset = *(uint64_t *)(ldata.data + (long)pVVar11 * 0x10);
              lVar24 = BinaryLambdaWrapper::
                       Operation<duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,long,duckdb::list_entry_t>
                                 (fun_02,left_01,*(long *)(local_c0.data + (long)pVVar15 * 8),
                                  pVVar15,in_R8);
              puVar19[-1] = lVar24.offset;
              *puVar19 = lVar24.length;
              puVar19 = puVar19 + 2;
            }
          }
          else {
            puVar19 = (uint64_t *)(pdVar5 + 8);
            for (pVVar14 = (ValidityMask *)0x0; count != pVVar14;
                pVVar14 = (ValidityMask *)
                          ((long)&(pVVar14->super_TemplatedValidityMask<unsigned_long>).
                                  validity_mask + 1)) {
              pVVar11 = pVVar14;
              if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                pVVar11 = (ValidityMask *)(ulong)(ldata.sel)->sel_vector[(long)pVVar14];
              }
              pVVar15 = pVVar14;
              if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
                pVVar15 = (ValidityMask *)(ulong)(local_c0.sel)->sel_vector[(long)pVVar14];
              }
              if (((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pVVar11 >> 6] >> ((ulong)pVVar11 & 0x3f) & 1) != 0)) &&
                 ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pVVar15 >> 6] >> ((ulong)pVVar15 & 0x3f) & 1) != 0)))) {
                fun_08.result = result;
                fun_08.current_size = &current_size;
                fun_08.source_child = pVVar8;
                fun_08.result_child = pVVar9;
                left_05.length = *(uint64_t *)(ldata.data + (long)pVVar11 * 0x10 + 8);
                left_05.offset = *(uint64_t *)(ldata.data + (long)pVVar11 * 0x10);
                lVar24 = BinaryLambdaWrapper::
                         Operation<duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,long,duckdb::list_entry_t>
                                   (fun_08,left_05,*(long *)(local_c0.data + (long)pVVar15 * 8),
                                    pVVar15,in_R8);
                puVar19[-1] = lVar24.offset;
                *puVar19 = lVar24.length;
              }
              else {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
                           (idx_t)pVVar14);
              }
              puVar19 = puVar19 + 2;
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat(&local_c0);
          UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
        }
        goto LAB_00d5c4ef;
      }
      plVar4 = (list_entry_t *)vector->data;
      puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar5 = vector_00->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar7 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::SetValidity(result,&vector_00->validity);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          puVar19 = (uint64_t *)(pdVar7 + 8);
          for (pVVar11 = (ValidityMask *)0x0; count != pVVar11;
              pVVar11 = (ValidityMask *)
                        ((long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask
                        + 1)) {
            fun_09.result = result;
            fun_09.current_size = &current_size;
            fun_09.source_child = pVVar8;
            fun_09.result_child = pVVar9;
            lVar24 = BinaryLambdaWrapper::
                     Operation<duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,long,duckdb::list_entry_t>
                               (fun_09,*plVar4,*(long *)(pdVar5 + (long)pVVar11 * 8),pVVar14,in_R8);
            puVar19[-1] = lVar24.offset;
            *puVar19 = lVar24.length;
            puVar19 = puVar19 + 2;
          }
        }
        else {
          pVVar14 = (ValidityMask *)0x0;
          for (pVVar11 = (ValidityMask *)0x0;
              pVVar11 !=
              (ValidityMask *)
              ((ulong)((long)&count[1].super_TemplatedValidityMask<unsigned_long>.capacity + 7U) >>
              6); pVVar11 = (ValidityMask *)
                            ((long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>).
                                    validity_mask + 1)) {
            puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar3 == (unsigned_long *)0x0) {
              pVVar15 = pVVar14 + 2;
              if (count <= pVVar14 + 2) {
                pVVar15 = count;
              }
LAB_00d5c12b:
              puVar19 = (uint64_t *)(pdVar7 + (long)pVVar14 * 0x10 + 8);
              pVVar10 = pVVar11;
              for (; pVVar12 = pVVar14, pVVar14 < pVVar15;
                  pVVar14 = (ValidityMask *)
                            ((long)&(pVVar14->super_TemplatedValidityMask<unsigned_long>).
                                    validity_mask + 1)) {
                fun_03.result = result;
                fun_03.current_size = &current_size;
                fun_03.source_child = pVVar8;
                fun_03.result_child = pVVar9;
                lVar24 = BinaryLambdaWrapper::
                         Operation<duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,long,duckdb::list_entry_t>
                                   (fun_03,*plVar4,*(long *)(pdVar5 + (long)pVVar14 * 8),pVVar10,
                                    in_R8);
                puVar19[-1] = lVar24.offset;
                *puVar19 = lVar24.length;
                puVar19 = puVar19 + 2;
              }
            }
            else {
              uVar17 = puVar3[(long)pVVar11];
              pVVar15 = pVVar14 + 2;
              if (count <= pVVar14 + 2) {
                pVVar15 = count;
              }
              if (uVar17 == 0xffffffffffffffff) goto LAB_00d5c12b;
              pVVar12 = pVVar15;
              if (uVar17 != 0) {
                puVar19 = (uint64_t *)(pdVar7 + (long)pVVar14 * 0x10 + 8);
                pVVar10 = pVVar11;
                for (uVar20 = 0;
                    pVVar12 = (ValidityMask *)
                              ((long)&(pVVar14->super_TemplatedValidityMask<unsigned_long>).
                                      validity_mask + uVar20), pVVar12 < pVVar15;
                    uVar20 = uVar20 + 1) {
                  if ((uVar17 >> (uVar20 & 0x3f) & 1) != 0) {
                    fun_04.result = result;
                    fun_04.current_size = &current_size;
                    fun_04.source_child = pVVar8;
                    fun_04.result_child = pVVar9;
                    lVar24 = BinaryLambdaWrapper::
                             Operation<duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,long,duckdb::list_entry_t>
                                       (fun_04,*plVar4,
                                        *(long *)(pdVar5 + uVar20 * 8 + (long)pVVar14 * 8),pVVar10,
                                        in_R8);
                    puVar19[-1] = lVar24.offset;
                    *puVar19 = lVar24.length;
                  }
                  puVar19 = puVar19 + 2;
                }
              }
            }
            pVVar14 = pVVar12;
          }
        }
        goto LAB_00d5c4ef;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
LAB_00d5c4ef:
  ListVector::SetListSize(result,current_size);
  return;
}

Assistant:

static void RepeatListFunction(DataChunk &args, ExpressionState &, Vector &result) {
	auto &list_vector = args.data[0];
	auto &cnt_vector = args.data[1];

	auto &source_child = ListVector::GetEntry(list_vector);
	auto &result_child = ListVector::GetEntry(result);

	idx_t current_size = ListVector::GetListSize(result);
	BinaryExecutor::Execute<list_entry_t, int64_t, list_entry_t>(
	    list_vector, cnt_vector, result, args.size(), [&](list_entry_t list_input, int64_t cnt) {
		    idx_t copy_count = cnt <= 0 || list_input.length == 0 ? 0 : UnsafeNumericCast<idx_t>(cnt);
		    idx_t result_length = list_input.length * copy_count;
		    idx_t new_size = current_size + result_length;
		    ListVector::Reserve(result, new_size);
		    list_entry_t result_list;
		    result_list.offset = current_size;
		    result_list.length = result_length;
		    for (idx_t i = 0; i < copy_count; i++) {
			    // repeat the list contents "cnt" times
			    VectorOperations::Copy(source_child, result_child, list_input.offset + list_input.length,
			                           list_input.offset, current_size);
			    current_size += list_input.length;
		    }
		    return result_list;
	    });
	ListVector::SetListSize(result, current_size);
}